

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O1

gs_expr_t * gs_parse_expr_factor(gs_parser_t *parser)

{
  gs_token_t *pgVar1;
  anon_union_8_5_f029217d_for_gs_token_3 aVar2;
  gs_token_type gVar3;
  int iVar4;
  int iVar5;
  undefined4 uVar6;
  gs_expr_t *pgVar7;
  gs_expr_t *pgVar8;
  int iVar9;
  gs_expr_t *pgVar10;
  bool bVar11;
  bool bVar12;
  gs_token_t token;
  
  pgVar1 = (parser->tokens).data;
  aVar2 = pgVar1[parser->cur_token].field_3;
  pgVar1 = pgVar1 + parser->cur_token;
  gVar3 = pgVar1->type;
  iVar4 = pgVar1->line;
  iVar5 = pgVar1->col;
  uVar6 = *(undefined4 *)&pgVar1->field_0xc;
  pgVar7 = gs_parse_expr_cast(parser);
  pgVar10 = pgVar7;
  if (parser->error == false) {
    do {
      pgVar1 = (parser->tokens).data;
      iVar9 = parser->cur_token;
      bVar11 = pgVar1[iVar9].type != GS_TOKEN_CHAR;
      bVar12 = pgVar1[iVar9].field_3.c != '*';
      if (bVar12 || bVar11) {
LAB_0013c442:
        iVar9 = parser->cur_token;
        bVar11 = pgVar1[iVar9].type == GS_TOKEN_CHAR;
        bVar12 = pgVar1[iVar9].field_3.c == '/';
        if (bVar12 && bVar11) {
          if (iVar9 < (parser->tokens).length) {
            parser->cur_token = iVar9 + 1;
          }
          iVar9 = 3;
          if (bVar12 && bVar11) goto LAB_0013c474;
        }
LAB_0013c482:
        bVar11 = false;
        pgVar7 = pgVar10;
      }
      else {
        if (iVar9 < (parser->tokens).length) {
          parser->cur_token = iVar9 + 1;
        }
        iVar9 = 2;
        if (bVar12 || bVar11) goto LAB_0013c442;
LAB_0013c474:
        pgVar8 = gs_parse_expr_cast(parser);
        if (parser->error != false) goto LAB_0013c482;
        pgVar7 = (gs_expr_t *)gs_parser_alloc(parser,0x40);
        pgVar7->type = GS_EXPR_BINARY_OP;
        (pgVar7->token).type = gVar3;
        (pgVar7->token).line = iVar4;
        (pgVar7->token).col = iVar5;
        *(undefined4 *)&(pgVar7->token).field_0xc = uVar6;
        (pgVar7->token).field_3 = aVar2;
        (pgVar7->field_2).int_val = iVar9;
        (pgVar7->field_2).binary_op.left = pgVar10;
        (pgVar7->field_2).binary_op.right = pgVar8;
        bVar11 = true;
      }
      pgVar10 = pgVar7;
    } while (bVar11);
  }
  return pgVar7;
}

Assistant:

static gs_expr_t *gs_parse_expr_factor(gs_parser_t *parser) {
    gs_token_t token = gs_peek(parser);
    gs_expr_t *expr = gs_parse_expr_cast(parser);
    if (parser->error) goto cleanup;

    while (true) {
        gs_binary_op_type binary_op_type;
        if (gs_eat_char(parser, '*')) {
            binary_op_type = GS_BINARY_OP_MUL;
        }
        else if (gs_eat_char(parser, '/')) {
            binary_op_type = GS_BINARY_OP_DIV;
        }
        else {
            break;
        }

        gs_expr_t *right = gs_parse_expr_cast(parser);
        if (parser->error) goto cleanup;
        expr = gs_expr_binary_op_new(parser, token, binary_op_type, expr, right);
    }

cleanup:
    return expr;
}